

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureHelper::qt_CompressedTextureSubImage2D
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLint level,
          GLint xoffset,GLint yoffset,GLsizei width,GLsizei height,GLenum format,GLsizei imageSize,
          GLvoid *bits)

{
  undefined8 in_RDI;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  TextureBinder binder;
  GLenum in_stack_ffffffffffffff8c;
  GLenum in_stack_ffffffffffffff90;
  GLuint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TextureBinder *in_stack_ffffffffffffffa0;
  undefined1 *puVar1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined8 uVar2;
  GLenum format_00;
  GLsizei imageSize_00;
  GLvoid *data;
  
  data = *(GLvoid **)(in_FS_OFFSET + 0x28);
  format_00 = 0xaaaaaaaa;
  imageSize_00 = -0x55555556;
  puVar1 = &stack0xffffffffffffffd8;
  uVar2 = in_RDI;
  anon_unknown.dwarf_18e721::TextureBinder::TextureBinder
            (in_stack_ffffffffffffffa0,
             (QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  glCompressedTexSubImage2D
            ((QOpenGLTextureHelper *)CONCAT44(in_R9D,in_stack_ffffffffffffffb8),
             (GLenum)((ulong)puVar1 >> 0x20),(GLint)puVar1,(GLint)((ulong)in_RDI >> 0x20),
             (GLint)in_RDI,xoffset,(GLsizei)uVar2,format_00,imageSize_00,data);
  anon_unknown.dwarf_18e721::TextureBinder::~TextureBinder((TextureBinder *)0x1a83a4);
  if (*(GLvoid **)(in_FS_OFFSET + 0x28) == data) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_CompressedTextureSubImage2D(GLuint texture, GLenum target, GLenum bindingTarget, GLint level, GLint xoffset, GLint yoffset, GLsizei width, GLsizei height, GLenum format, GLsizei imageSize, const GLvoid *bits)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    glCompressedTexSubImage2D(target, level, xoffset, yoffset, width, height, format, imageSize, bits);
}